

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool duckdb_re2::re2_internal::Parse<double>(char *str,size_t n,double *dest)

{
  char *__nptr;
  int *piVar1;
  double dVar2;
  char *end;
  char buf [201];
  size_t local_108;
  char *local_100;
  char local_f8 [208];
  
  if (n != 0) {
    local_108 = n;
    __nptr = TerminateNumber(local_f8,0xc9,str,&local_108,true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar2 = strtod(__nptr,&local_100);
    if ((local_100 == __nptr + local_108) && (*piVar1 == 0)) {
      if (dest == (double *)0x0) {
        return true;
      }
      *dest = dVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Parse(const char* str, size_t n, double* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r = strtod(str, &end);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}